

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

string * __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAttribute<std::__cxx11::string>
          (string *__return_storage_ptr__,OgreXmlSerializer *this,char *name)

{
  XmlReader *reader;
  int iVar1;
  undefined4 extraout_var;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  iVar1 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,name);
  if ((char *)CONCAT44(extraout_var,iVar1) != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)CONCAT44(extraout_var,iVar1),
               (allocator<char> *)&local_58);
    return __return_storage_ptr__;
  }
  reader = this->m_reader;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,name,&local_59);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_5a);
  ThrowAttibuteError(reader,&local_58,&local_38);
}

Assistant:

std::string OgreXmlSerializer::ReadAttribute<std::string>(const char *name) const
{
    const char* value = m_reader->getAttributeValue(name);
    if (value)
    {
        return std::string(value);
    }
    else
    {
        ThrowAttibuteError(m_reader, name);
        return "";
    }
}